

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

int Parser_LoadDocument(IXML_Document_conflict **retDoc,char *xmlFileName,int file)

{
  ixml_membuf *m;
  byte bVar1;
  char cVar2;
  _IXML_NamespaceURI *p_Var3;
  int iVar4;
  uint uVar5;
  Parser *xmlParser;
  FILE *__stream;
  size_t sVar6;
  char *pcVar7;
  IXML_Attr *pIVar8;
  ptrdiff_t pVar9;
  char *pcVar10;
  IXML_Attr *pIVar11;
  IXML_ElementStack *pIVar12;
  int iVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  ixml_membuf *m_00;
  IXML_ElementStack *pCur;
  byte *pbVar16;
  long lVar17;
  int num;
  int iVar18;
  Nodeptr_conflict p_Var19;
  IXML_NamespaceURI *pIVar20;
  IXML_Node_conflict *pIVar21;
  bool bVar22;
  IXML_Document_conflict *gRootDoc;
  IXML_Node_conflict *tempNode;
  IXML_Node_conflict newNode;
  IXML_Attr *local_c8;
  IXML_Node_conflict *local_c0;
  IXML_Document_conflict **local_b8;
  IXML_Node_conflict *local_b0;
  IXML_Node_conflict *local_a8;
  IXML_Node_conflict local_a0;
  
  xmlParser = (Parser *)calloc(1,0x78);
  if (xmlParser == (Parser *)0x0) {
    return 0x66;
  }
  m = &xmlParser->tokenBuf;
  ixml_membuf_init(m);
  m_00 = &xmlParser->lastElem;
  ixml_membuf_init(m_00);
  if (file == 0) {
    pcVar7 = safe_strdup(xmlFileName);
    xmlParser->dataBuffer = pcVar7;
    if (pcVar7 == (char *)0x0) {
      iVar4 = 0x66;
      goto LAB_00103734;
    }
LAB_001035d4:
    xmlParser->curPtr = pcVar7;
    local_c0 = (IXML_Node_conflict *)0x0;
    local_a8 = (IXML_Node_conflict *)0x0;
    local_b0 = (IXML_Node_conflict *)0x0;
    ixmlNode_init(&local_a0);
    iVar4 = ixmlDocument_createDocumentEx((IXML_Document_conflict **)&local_c0);
    if (iVar4 == 0) {
      xmlParser->currentNodePtr = local_c0;
      pcVar7 = xmlParser->curPtr;
      if (((*pcVar7 == -0x11) && (pcVar7[1] == -0x45)) && (pcVar7[2] == -0x41)) {
        xmlParser->curPtr = pcVar7 + 3;
      }
      Parser_skipWhiteSpaces(xmlParser);
      pcVar7 = xmlParser->curPtr;
      iVar4 = strncmp(pcVar7,"<?xml ",6);
      if (iVar4 == 0) {
        if (pcVar7 == (char *)0x0) {
          iVar4 = 0x6a;
        }
        else {
          iVar4 = 0xc;
          cVar2 = *pcVar7;
          while (cVar2 != '\0') {
            pcVar10 = pcVar7 + 1;
            if ((cVar2 == '?') && (*pcVar10 == '>')) {
              xmlParser->curPtr = pcVar7 + 2;
              Parser_skipWhiteSpaces(xmlParser);
              goto LAB_00103655;
            }
            xmlParser->curPtr = pcVar10;
            pcVar7 = pcVar10;
            cVar2 = *pcVar10;
          }
        }
        Parser_skipWhiteSpaces(xmlParser);
      }
      else {
LAB_00103655:
        iVar4 = Parser_skipMisc(xmlParser);
        if (iVar4 == 0) {
          pcVar7 = xmlParser->curPtr;
          iVar4 = strncmp(pcVar7,"<!DOCTYPE",9);
          if (iVar4 == 0) {
            pbVar16 = (byte *)(pcVar7 + 1);
            xmlParser->curPtr = (char *)pbVar16;
            iVar18 = 1;
            iVar4 = 0xc;
            local_b8 = retDoc;
            do {
              bVar1 = *pbVar16;
              if (bVar1 < 0x3c) {
                if (bVar1 == 0x22) {
                  pbVar16 = (byte *)strchr((char *)(pbVar16 + 1),0x22);
                  if (pbVar16 == (byte *)0x0) goto LAB_001036fc;
                }
                else if (bVar1 == 0) goto LAB_001036fc;
              }
              else if (bVar1 == 0x3e) {
                iVar18 = iVar18 + -1;
              }
              else if (bVar1 == 0x3c) {
                iVar18 = iVar18 + 1;
              }
              pbVar16 = pbVar16 + 1;
            } while (iVar18 != 0);
            xmlParser->curPtr = (char *)pbVar16;
            retDoc = local_b8;
          }
          iVar4 = Parser_skipMisc(xmlParser);
          if (iVar4 == 0) {
            local_b8 = retDoc;
            ixmlNode_init(&local_a0);
            pcVar7 = xmlParser->curPtr;
            if (*pcVar7 != '\0') {
LAB_001037b8:
              if (xmlParser->state == eCONTENT) {
                xmlParser->savePtr = pcVar7;
                Parser_skipWhiteSpaces(xmlParser);
                pIVar11 = (IXML_Attr *)xmlParser->curPtr;
                cVar2 = *(char *)&(pIVar11->n).nodeName;
                if (cVar2 == '\0') goto LAB_00103d17;
                if (cVar2 != '<') {
                  pIVar11 = (IXML_Attr *)xmlParser->savePtr;
                  xmlParser->curPtr = (char *)pIVar11;
                  cVar2 = *(char *)&(pIVar11->n).nodeName;
                  local_c8 = pIVar11;
                  while (cVar2 != '<') {
                    if ((cVar2 == ']') && (*(char *)((long)&(local_c8->n).nodeName + 1) == ']')) {
                      bVar22 = *(char *)((long)&(local_c8->n).nodeName + 2) == '>';
                    }
                    else {
                      bVar22 = false;
                    }
                    if ((cVar2 == '\0') || (bVar22)) break;
                    pIVar21 = &local_c8->n;
                    local_c8 = (IXML_Attr *)((long)&(local_c8->n).nodeName + 1);
                    cVar2 = *(char *)((long)&pIVar21->nodeName + 1);
                  }
                  if (((*(char *)&(local_c8->n).nodeName == ']') &&
                      (*(char *)((long)&(local_c8->n).nodeName + 1) == ']')) &&
                     (*(char *)((long)&(local_c8->n).nodeName + 2) == '>')) {
                    uVar14 = 0xc;
                    iVar4 = 0x608;
                  }
                  else {
                    lVar17 = (long)local_c8 - (long)pIVar11;
                    ixml_membuf_destroy(m);
                    iVar4 = Parser_copyToken(xmlParser,xmlParser->curPtr,lVar17);
                    uVar14 = 0xc;
                    if (iVar4 == 0) {
                      if (m->buf == (char *)0x0) {
                        iVar4 = 0x621;
                      }
                      else {
                        local_a0.nodeValue = strdup(m->buf);
                        if (local_a0.nodeValue == (char *)0x0) {
                          uVar14 = 0x66;
                          iVar4 = 0x61c;
                        }
                        else {
                          local_a0.nodeName = strdup("#text");
                          if (local_a0.nodeName != (char *)0x0) {
                            local_a0.nodeType = eTEXT_NODE;
                            xmlParser->curPtr = xmlParser->curPtr + lVar17;
                            goto LAB_00103d17;
                          }
                          iVar4 = 0x628;
                          uVar14 = 0xc;
                        }
                      }
                    }
                    else {
                      iVar4 = 0x613;
                    }
                  }
                  goto LAB_001044d4;
                }
                local_c8 = pIVar11;
                iVar4 = strncmp((char *)pIVar11,"<![CDATA[",9);
                if (iVar4 == 0) {
                  pIVar21 = &pIVar11->n;
                  pIVar11 = (IXML_Attr *)((long)&(pIVar11->n).nodeValue + 4);
                  sVar6 = 0;
                  do {
                    bVar1 = *(byte *)((long)&pIVar11[-1].ownerElement + 5);
                    if ((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) {
                      uVar14 = 0xc;
                      iVar4 = 0x5da;
                      if (0xd7df < (int)(char)bVar1 - 0x20U) goto LAB_001044d4;
                      if (((bVar1 == 0x5d) &&
                          (*(char *)((long)&pIVar11[-1].ownerElement + 6) == ']')) &&
                         (*(char *)((long)&pIVar11[-1].ownerElement + 7) == '>'))
                      goto code_r0x00103c68;
                    }
                    pIVar11 = (IXML_Attr *)((long)&(pIVar11->n).nodeName + 1);
                    sVar6 = sVar6 + 1;
                  } while( true );
                }
                iVar4 = strncmp((char *)pIVar11,"<!--",4);
                if (iVar4 != 0) {
                  if (*(char *)((long)&(pIVar11->n).nodeName + 1) != '?') {
                    xmlParser->state = eELEMENT;
                    goto LAB_00103d17;
                  }
                  iVar4 = strncasecmp((char *)pIVar11,"<?xml ",6);
                  if ((iVar4 == 0) || (iVar4 = strncasecmp((char *)pIVar11,"<?xml?",6), iVar4 == 0))
                  {
LAB_001043b6:
                    uVar14 = 0xc;
                    iVar4 = 0x5ee;
                    goto LAB_001044d4;
                  }
                  iVar4 = strncasecmp((char *)pIVar11,"<?",2);
                  if (iVar4 == 0) {
                    pIVar8 = (IXML_Attr *)strstr((char *)pIVar11,"?>");
                    if (pIVar8 == (IXML_Attr *)0x0) goto LAB_001043b6;
                    uVar14 = 0xc;
                    iVar4 = 0x5ee;
                    if (pIVar8 == pIVar11) goto LAB_001044d4;
                    pIVar11 = (IXML_Attr *)((long)&(pIVar8->n).nodeName + 2);
                  }
                  goto LAB_00103cd8;
                }
                iVar4 = Parser_skipComment((char **)&local_c8);
                pIVar11 = local_c8;
                if (iVar4 != 0) {
                  uVar14 = 0xc;
                  iVar4 = 0x5e4;
                  goto LAB_001044d4;
                }
                goto LAB_00103d13;
              }
              Parser_skipWhiteSpaces(xmlParser);
              pVar9 = Parser_getNextToken(xmlParser);
              if (((pVar9 == 0) && (xmlParser->pCurElement == (IXML_ElementStack *)0x0)) &&
                 (*xmlParser->curPtr == '\0')) goto LAB_00103d17;
              if ((xmlParser->tokenBuf).length == 0) {
                uVar14 = 0xc;
                iVar4 = 0x82e;
                goto LAB_001044fa;
              }
              pcVar7 = m->buf;
              cVar2 = *pcVar7;
              if (cVar2 != '/') {
                if (cVar2 == '>') goto LAB_00103d17;
                if (cVar2 != '<') goto LAB_00103aca;
                if ((pcVar7[1] == '/') && (pcVar7[2] == '\0')) {
                  pVar9 = Parser_getNextToken(xmlParser);
                  if (pVar9 == 0) {
                    uVar14 = 0xc;
                    iVar4 = 0x64f;
                  }
                  else {
                    uVar14 = 0xc;
                    if (m->buf == (char *)0x0) {
                      iVar4 = 0x656;
                    }
                    else {
                      local_a0.nodeName = strdup(m->buf);
                      if (local_a0.nodeName == (char *)0x0) {
                        iVar4 = 0x65c;
                        uVar14 = 0x66;
                      }
                      else {
                        local_a0.nodeValue = (char *)0x0;
                        local_a0.nodeType = eELEMENT_NODE;
                        Parser_skipWhiteSpaces(xmlParser);
                        pVar9 = Parser_getNextToken(xmlParser);
                        if (pVar9 == 0) {
                          iVar4 = 0x668;
                        }
                        else {
                          pcVar7 = m->buf;
                          if (pcVar7 == (char *)0x0) {
                            iVar4 = 0x670;
                          }
                          else {
                            iVar4 = 0x676;
                            if ((*pcVar7 == '>') && (pcVar7[1] == '\0')) {
                              if (local_a0.nodeName == (char *)0x0) {
                                __assert_fail("newNode->nodeName",
                                              "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                              ,0x9e8,
                                              "int Parser_eTagVerification(Parser *, IXML_Node *)");
                              }
                              goto LAB_00103ff6;
                            }
                          }
                        }
                      }
                    }
                  }
                  IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                             ,iVar4,"Parser_processETag","Error %d\n",uVar14);
                  iVar4 = 0x83a;
                  goto LAB_001044fa;
                }
                uVar14 = 0xc;
                pVar9 = Parser_getNextToken(xmlParser);
                iVar4 = 0x83e;
                if ((pVar9 == 0) || (m->buf == (char *)0x0)) goto LAB_001044fa;
                local_a0.nodeName = strdup(m->buf);
                if (local_a0.nodeName == (char *)0x0) {
                  uVar14 = 0x66;
                  goto LAB_001044fa;
                }
                iVar18 = ixml_membuf_assign_str(m_00,local_a0.nodeName);
                if ((iVar18 != 0) ||
                   (iVar18 = Parser_setNodePrefixAndLocalName(&local_a0), iVar18 != 0)) {
                  uVar14 = 0x6a;
                  goto LAB_001044fa;
                }
                local_a0.nodeValue = (char *)0x0;
                local_a0.nodeType = eELEMENT_NODE;
                xmlParser->savePtr = xmlParser->curPtr;
                pVar9 = Parser_getNextToken(xmlParser);
                if (pVar9 == 0) goto LAB_001044fa;
                pcVar7 = m->buf;
                if (*pcVar7 == '>') {
                  if (pcVar7[1] != '\0') goto LAB_00103d08;
                  goto LAB_0010411b;
                }
                if (((*pcVar7 == '/') && (pcVar7[1] == '>')) && (pcVar7[2] == '\0')) {
                  xmlParser->state = eELEMENT;
                }
                else {
LAB_00103d08:
                  xmlParser->state = eATTRIBUTE;
                }
                goto LAB_00103d0f;
              }
              if ((pcVar7[1] != '>') || (pcVar7[2] != '\0')) {
LAB_00103aca:
                if (xmlParser->pCurElement == (IXML_ElementStack *)0x0) {
                  uVar14 = 0xc;
                  iVar4 = 0x865;
                }
                else {
                  uVar14 = 0xc;
                  if (xmlParser->state == eATTRIBUTE) {
                    uVar5 = Parser_UTF8ToInt(pcVar7,(ptrdiff_t *)&local_c8);
                    iVar18 = 0;
                    iVar4 = 0xce;
                    do {
                      iVar13 = (iVar18 + iVar4) / 2;
                      if ((int)uVar5 < (int)(uint)Letter[iVar13].l) {
                        iVar4 = iVar13 + -1;
                      }
                      else {
                        if (uVar5 <= Letter[iVar13].h) goto LAB_00103b36;
                        iVar18 = iVar13 + 1;
                      }
                      if (iVar4 < iVar18) {
                        uVar15 = 0xc;
                        iVar4 = 0x786;
                        goto LAB_00104265;
                      }
                    } while( true );
                  }
                  iVar4 = 0x860;
                }
                goto LAB_001044fa;
              }
              if (m_00->buf == (char *)0x0) {
                uVar14 = 0xc;
                iVar4 = 0x844;
                goto LAB_001044fa;
              }
              local_a0.nodeName = strdup(m_00->buf);
              if (local_a0.nodeName == (char *)0x0) {
                uVar14 = 0x66;
                iVar4 = 0x84b;
                goto LAB_001044fa;
              }
              local_a0.nodeType = eELEMENT_NODE;
LAB_00103ff6:
              pIVar21 = xmlParser->currentNodePtr;
              if (pIVar21 == (IXML_Node_conflict *)0x0) {
                __assert_fail("xmlParser->currentNodePtr",
                              "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                              ,0x9e9,"int Parser_eTagVerification(Parser *, IXML_Node *)");
              }
              if (local_a0.nodeType == eELEMENT_NODE) {
                pIVar12 = xmlParser->pCurElement;
                iVar4 = 0xc;
                if (pIVar12 == (IXML_ElementStack *)0x0) goto LAB_001036fc;
                if (pIVar12->element == (char *)0x0) {
                  __assert_fail("xmlParser->pCurElement->element",
                                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                ,0x9bf,"int Parser_isValidEndElement(Parser *, IXML_Node *)");
                }
                iVar18 = strcmp(pIVar12->element,local_a0.nodeName);
                if (iVar18 != 0) goto LAB_001036fc;
                xmlParser->pCurElement = pIVar12->nextElement;
                Parser_freeElementStackItem(pIVar12);
                pIVar20 = pIVar12->pNsURI;
                while (pIVar20 != (IXML_NamespaceURI *)0x0) {
                  p_Var3 = pIVar20->nextNsURI;
                  Parser_freeNsURI(pIVar20);
                  free(pIVar20);
                  pIVar20 = p_Var3;
                }
                free(pIVar12);
                pIVar21 = xmlParser->currentNodePtr;
              }
              iVar4 = strcmp(local_a0.nodeName,pIVar21->nodeName);
              if (iVar4 == 0) {
                xmlParser->currentNodePtr = pIVar21->parentNode;
                xmlParser->state = eCONTENT;
                goto switchD_00103d34_default;
              }
              goto LAB_0010428b;
            }
LAB_0010421a:
            iVar4 = 0xc;
            if (xmlParser->pCurElement == (IXML_ElementStack *)0x0) {
              *local_b8 = (IXML_Document_conflict *)local_c0;
              Parser_free(xmlParser);
              return 0;
            }
          }
        }
      }
    }
LAB_001036fc:
    Parser_freeNodeContent(&local_a0);
    ixmlDocument_free((IXML_Document_conflict *)local_c0);
  }
  else {
    __stream = fopen(xmlFileName,"rb");
    if (__stream == (FILE *)0x0) {
      iVar4 = 0x65;
      goto LAB_00103734;
    }
    fseek(__stream,0,2);
    sVar6 = ftell(__stream);
    if ((long)sVar6 < 1) {
      iVar4 = 0xc;
    }
    else {
      pcVar7 = (char *)malloc(sVar6 + 1);
      xmlParser->dataBuffer = pcVar7;
      if (pcVar7 != (char *)0x0) {
        fseek(__stream,0,0);
        sVar6 = fread(xmlParser->dataBuffer,1,sVar6,__stream);
        xmlParser->dataBuffer[sVar6] = '\0';
        fclose(__stream);
        pcVar7 = xmlParser->dataBuffer;
        goto LAB_001035d4;
      }
      iVar4 = 0x66;
    }
    fclose(__stream);
  }
LAB_00103734:
  Parser_free(xmlParser);
  return iVar4;
code_r0x00103c68:
  if ((long)sVar6 < 1) {
LAB_001044d4:
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar4,"Parser_processContent","Error %d\n");
    iVar4 = 0x821;
    goto LAB_001044fa;
  }
  pcVar7 = (char *)malloc(sVar6 + 1);
  local_a0.nodeValue = pcVar7;
  if (pcVar7 == (char *)0x0) {
    uVar14 = 0xc;
    iVar4 = 0x5da;
    goto LAB_001044d4;
  }
  strncpy(pcVar7,(char *)((long)&pIVar21->nodeValue + 1),sVar6);
  pcVar7[sVar6] = '\0';
  local_a0.nodeName = strdup("#cdata-section");
  uVar14 = 0xc;
  iVar4 = 0x5da;
  if (local_a0.nodeName == (char *)0x0) goto LAB_001044d4;
  local_a0.nodeType = eCDATA_SECTION_NODE;
LAB_00103cd8:
  xmlParser->curPtr = (char *)pIVar11;
LAB_00103d17:
  pcVar7 = local_a0.nodeName;
  pIVar21 = local_c0;
  switch(local_a0.nodeType) {
  case eELEMENT_NODE:
    local_c8 = (IXML_Attr *)0x0;
    if (xmlParser->bHasTopLevel == 0) {
      xmlParser->bHasTopLevel = 1;
    }
    else if (xmlParser->pCurElement == (IXML_ElementStack *)0x0) {
LAB_0010428b:
      iVar4 = 0xc;
      goto LAB_001036fc;
    }
    xmlParser->savePtr = xmlParser->curPtr;
    iVar4 = ixmlDocument_createElementEx
                      ((IXML_Document_conflict *)local_c0,local_a0.nodeName,
                       (IXML_Element **)&local_c8);
    if (iVar4 != 0) goto LAB_001036fc;
    iVar4 = ixmlNode_setNodeProperties(&local_c8->n,&local_a0);
    pcVar7 = local_a0.prefix;
    if (iVar4 != 0) goto LAB_0010435f;
    pIVar12 = xmlParser->pCurElement;
    if (local_a0.prefix == (char *)0x0) {
      for (; pIVar12 != (IXML_ElementStack *)0x0; pIVar12 = pIVar12->nextElement) {
        if ((pIVar12->prefix == (char *)0x0) &&
           (pcVar7 = pIVar12->namespaceUri, pcVar7 != (char *)0x0)) {
          if (local_c8 != (IXML_Attr *)0x0) goto LAB_00104146;
          pIVar11 = (IXML_Attr *)0x0;
          goto LAB_00104156;
        }
      }
      pIVar11 = local_c8;
      if (xmlParser->state == eATTRIBUTE) goto LAB_00103f2c;
    }
    else {
      for (; pIVar12 != (IXML_ElementStack *)0x0; pIVar12 = pIVar12->nextElement) {
        if ((pIVar12->prefix != (char *)0x0) && (iVar4 = strcmp(pIVar12->prefix,pcVar7), iVar4 == 0)
           ) {
          pIVar20 = (IXML_NamespaceURI *)&pIVar12->namespaceUri;
LAB_0010412e:
          pcVar7 = pIVar20->nsURI;
          pIVar11 = local_c8;
          if (local_c8 != (IXML_Attr *)0x0 && pcVar7 != (char *)0x0) {
LAB_00104146:
            pIVar11 = local_c8;
            if ((local_c8->n).namespaceURI == (char *)0x0) {
              pcVar7 = strdup(pcVar7);
              (pIVar11->n).namespaceURI = pcVar7;
            }
          }
          goto LAB_00104156;
        }
        for (pIVar20 = pIVar12->pNsURI; pIVar20 != (IXML_NamespaceURI *)0x0;
            pIVar20 = pIVar20->nextNsURI) {
          iVar4 = strcmp(pIVar20->prefix,pcVar7);
          if (iVar4 == 0) goto LAB_0010412e;
        }
      }
LAB_00103f2c:
      xmlParser->pNeedPrefixNode = &local_c8->n;
      pIVar11 = local_c8;
    }
LAB_00104156:
    iVar4 = ixmlNode_appendChild(xmlParser->currentNodePtr,&pIVar11->n);
    pIVar11 = local_c8;
    if (iVar4 != 0) {
LAB_0010435f:
      ixmlElement_free((IXML_Element *)local_c8);
      goto LAB_001036fc;
    }
    xmlParser->currentNodePtr = &local_c8->n;
    if (local_c8 == (IXML_Attr *)0x0) {
      __assert_fail("newElement",
                    "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                    ,0x90a,"int Parser_pushElement(Parser *, IXML_Node *)");
    }
    pIVar12 = (IXML_ElementStack *)calloc(1,0x28);
    iVar4 = 0x66;
    if (pIVar12 == (IXML_ElementStack *)0x0) goto LAB_001036fc;
    pcVar7 = safe_strdup((pIVar11->n).nodeName);
    pIVar12->element = pcVar7;
    if (pcVar7 == (char *)0x0) goto LAB_0010431a;
    pcVar7 = (pIVar11->n).prefix;
    if (pcVar7 != (char *)0x0) {
      pcVar7 = strdup(pcVar7);
      pIVar12->prefix = pcVar7;
      if (pcVar7 != (char *)0x0) goto LAB_001041cc;
LAB_00104312:
      Parser_freeElementStackItem(pIVar12);
LAB_0010431a:
      free(pIVar12);
      goto LAB_001036fc;
    }
LAB_001041cc:
    pcVar7 = (pIVar11->n).namespaceURI;
    if (pcVar7 != (char *)0x0) {
      pcVar7 = strdup(pcVar7);
      pIVar12->namespaceUri = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00104312;
    }
    pIVar12->nextElement = xmlParser->pCurElement;
    xmlParser->pCurElement = pIVar12;
    break;
  case eATTRIBUTE_NODE:
    local_c8 = (IXML_Attr *)0x0;
    for (p_Var19 = xmlParser->currentNodePtr->firstAttr; p_Var19 != (Nodeptr_conflict)0x0;
        p_Var19 = p_Var19->nextSibling) {
      iVar4 = strcmp(p_Var19->nodeName,pcVar7);
      if (iVar4 == 0) goto LAB_0010428b;
    }
    iVar4 = ixmlDocument_createAttributeEx((IXML_Document_conflict *)pIVar21,pcVar7,&local_c8);
    if (iVar4 != 0) goto LAB_001036fc;
    iVar4 = ixmlNode_setNodeProperties(&local_c8->n,&local_a0);
    if ((iVar4 != 0) ||
       (iVar4 = ixmlElement_setAttributeNode
                          ((IXML_Element *)xmlParser->currentNodePtr,local_c8,(IXML_Attr **)0x0),
       iVar4 != 0)) {
      ixmlAttr_free(local_c8);
      goto LAB_001036fc;
    }
    break;
  case eTEXT_NODE:
    iVar4 = ixmlDocument_createTextNodeEx
                      ((IXML_Document_conflict *)local_c0,local_a0.nodeValue,&local_a8);
    if (iVar4 != 0) goto LAB_001036fc;
    iVar4 = ixmlNode_appendChild(xmlParser->currentNodePtr,local_a8);
    pIVar21 = local_a8;
    goto joined_r0x00103dc1;
  case eCDATA_SECTION_NODE:
    iVar4 = ixmlDocument_createCDATASectionEx
                      ((IXML_Document_conflict *)local_c0,local_a0.nodeValue,
                       (IXML_CDATASection **)&local_b0);
    if (iVar4 != 0) goto LAB_001036fc;
    iVar4 = ixmlNode_appendChild(xmlParser->currentNodePtr,local_b0);
    pIVar21 = local_b0;
joined_r0x00103dc1:
    if (iVar4 != 0) {
      ixmlNode_free(pIVar21);
      goto LAB_001036fc;
    }
  }
switchD_00103d34_default:
  Parser_freeNodeContent(&local_a0);
  ixmlNode_init(&local_a0);
  pcVar7 = xmlParser->curPtr;
  if (*pcVar7 == '\0') goto LAB_0010421a;
  goto LAB_001037b8;
LAB_00103b36:
  local_a0.nodeName = strdup(pcVar7);
  uVar15 = 0x66;
  if (local_a0.nodeName == (char *)0x0) {
    iVar4 = 0x78d;
LAB_00104265:
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar4,"Parser_processAttribute","Error %d\n",uVar15);
  }
  else {
    pVar9 = Parser_getNextToken(xmlParser);
    if (pVar9 == 0) {
      iVar4 = 0x793;
LAB_001042ac:
      uVar15 = 0xc;
      goto LAB_00104265;
    }
    if (*m->buf != '=') {
      iVar4 = 0x79a;
      goto LAB_001042ac;
    }
    pVar9 = Parser_getNextToken(xmlParser);
    if (pVar9 == 0) {
      iVar4 = 0x7a0;
      goto LAB_001042ac;
    }
    cVar2 = *m->buf;
    if ((cVar2 != '\'') && (cVar2 != '\"')) {
      iVar4 = 0x7a7;
      goto LAB_001042ac;
    }
    pcVar7 = xmlParser->curPtr;
    pcVar10 = strstr(pcVar7,m->buf);
    if (pcVar10 == (char *)0x0) {
      iVar4 = 0x7ad;
      goto LAB_001042ac;
    }
    if (pcVar7 < pcVar10) {
      do {
        if (*pcVar7 == '<') {
          iVar4 = 0x7b6;
          goto LAB_001042ac;
        }
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != pcVar10);
    }
    ixml_membuf_destroy(m);
    lVar17 = (long)pcVar10 - (long)xmlParser->curPtr;
    if ((lVar17 != 0) && (iVar4 = Parser_copyToken(xmlParser,xmlParser->curPtr,lVar17), iVar4 != 0))
    {
      iVar4 = 0x7c6;
      goto LAB_001042ac;
    }
    xmlParser->curPtr = pcVar10 + 1;
    pcVar7 = (xmlParser->tokenBuf).buf;
    if (pcVar7 == (char *)0x0) {
      local_a0.nodeValue = (char *)malloc(1);
      *local_a0.nodeValue = '\0';
    }
    else {
      local_a0.nodeValue = strdup(pcVar7);
      if (local_a0.nodeValue == (char *)0x0) {
        iVar4 = 0x7d2;
        uVar15 = 0x66;
        goto LAB_00104265;
      }
    }
    local_a0.nodeType = eATTRIBUTE_NODE;
    uVar5 = Parser_xmlNamespace(xmlParser,&local_a0);
    if (uVar5 == 0) {
      xmlParser->savePtr = xmlParser->curPtr;
      pVar9 = Parser_getNextToken(xmlParser);
      if (pVar9 != 0) {
        pcVar7 = m->buf;
        if (*pcVar7 == '>') {
          if (pcVar7[1] == '\0') {
LAB_0010411b:
            xmlParser->state = eCONTENT;
            goto LAB_00103d17;
          }
        }
        else if ((*pcVar7 == '<') && (pcVar7[1] == '\0')) {
          uVar15 = 0x6a;
          iVar4 = 0x7ee;
          goto LAB_00104265;
        }
LAB_00103d0f:
        pIVar11 = (IXML_Attr *)xmlParser->savePtr;
LAB_00103d13:
        xmlParser->curPtr = (char *)pIVar11;
        goto LAB_00103d17;
      }
      iVar4 = 0x7e7;
      goto LAB_001042ac;
    }
    if (uVar5 != 0x68) {
      IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                 ,0x7e0,"Parser_processAttribute","Error %d\n",(ulong)uVar5);
    }
  }
  uVar14 = 0xc;
  iVar4 = 0x85a;
LAB_001044fa:
  IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
             ,iVar4,"Parser_getNextNode","Error %d\n",uVar14);
  iVar4 = 0x6a;
  goto LAB_001036fc;
}

Assistant:

int Parser_LoadDocument(
	/*! [out] The output document tree. */
	IXML_Document **retDoc,
	/*! [in] The file name or the buffer to copy, according to the
	 * parameter "file". */
	const char *xmlFileName,
	/*! [in] 1 if you want to read from a file, 0 if xmlFileName is
	 * the buffer to copy to the parser. */
	int file)
{
	int rc = IXML_SUCCESS;
	Parser *xmlParser = NULL;

	xmlParser = Parser_init();
	if (xmlParser == NULL) {
		return IXML_INSUFFICIENT_MEMORY;
	}

	rc = Parser_readFileOrBuffer(xmlParser, xmlFileName, file);
	if (rc != IXML_SUCCESS) {
		Parser_free(xmlParser);
		return rc;
	}

	xmlParser->curPtr = xmlParser->dataBuffer;
	rc = Parser_parseDocument(retDoc, xmlParser);
	return rc;
}